

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void wl_registry_handle_global
               (void *data,wl_registry *registry,uint name,char *interface,uint version)

{
  int iVar1;
  undefined8 uVar2;
  wl_seat_listener *pwVar3;
  
  iVar1 = strcmp(interface,"wl_output");
  if (iVar1 == 0) {
    uVar2 = wl_proxy_marshal_flags
                      (registry,0,&wl_output_interface,1,0,name,_wl_output_interface,1,0);
    *(undefined8 *)((long)data + 0x10) = uVar2;
    pwVar3 = (wl_seat_listener *)&wl_output_listener;
LAB_001074b1:
    wl_proxy_add_listener(uVar2,pwVar3,data);
    return;
  }
  iVar1 = strcmp(interface,"wl_compositor");
  if (iVar1 == 0) {
    uVar2 = wl_proxy_marshal_flags
                      (registry,0,&wl_compositor_interface,1,0,name,_wl_compositor_interface,1,0);
    *(undefined8 *)((long)data + 0x18) = uVar2;
  }
  else {
    iVar1 = strcmp(interface,"wl_shell");
    if (iVar1 == 0) {
      uVar2 = wl_proxy_marshal_flags
                        (registry,0,&wl_shell_interface,1,0,name,_wl_shell_interface,1,0);
      *(undefined8 *)((long)data + 0x20) = uVar2;
    }
    else {
      iVar1 = strcmp(interface,"wl_seat");
      if (iVar1 == 0) {
        uVar2 = wl_proxy_marshal_flags
                          (registry,0,&wl_seat_interface,1,0,name,_wl_seat_interface,1,0);
        *(undefined8 *)((long)data + 0x28) = uVar2;
        pwVar3 = &wl_seat_listener;
        goto LAB_001074b1;
      }
    }
  }
  return;
}

Assistant:

static void wl_registry_handle_global(void *data, struct wl_registry *registry, unsigned int name, const char *interface, unsigned int version)
{
  struct wl_data *wl_data = data;

  if (!strcmp(interface, "wl_output")) {
    wl_data->wl_output = wl_registry_bind(registry, name, &wl_output_interface, 1);
    wl_output_add_listener(wl_data->wl_output, &wl_output_listener, wl_data);
  }
  else if (!strcmp(interface, "wl_compositor")) {
    wl_data->wl_compositor = wl_registry_bind(registry, name, &wl_compositor_interface, 1);
  }
  else if (!strcmp(interface, "wl_shell")) {
    wl_data->wl_shell = wl_registry_bind(registry, name, &wl_shell_interface, 1);
  }
  else if (!strcmp(interface, "wl_seat")) {
    wl_data->wl_seat = wl_registry_bind(registry, name, &wl_seat_interface, 1);
    wl_seat_add_listener(wl_data->wl_seat, &wl_seat_listener, wl_data);
  }
}